

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_dec_sigpass_step_raw
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,
               OPJ_UINT32 vsc,OPJ_UINT32 ci)

{
  OPJ_UINT32 OVar1;
  byte bVar2;
  int iVar3;
  
  bVar2 = (char)ci * '\x03';
  if (((*flagsp >> (bVar2 & 0x1f) & 0x200010) == 0) && ((*flagsp >> (bVar2 & 0x1f) & 0x1ef) != 0)) {
    OVar1 = opj_mqc_raw_decode(&t1->mqc);
    if (OVar1 != 0) {
      OVar1 = opj_mqc_raw_decode(&t1->mqc);
      iVar3 = -oneplushalf;
      if (OVar1 == 0) {
        iVar3 = oneplushalf;
      }
      *datap = iVar3;
      opj_t1_update_flags(flagsp,ci,OVar1,t1->w + 2,vsc);
    }
    *flagsp = *flagsp | 0x200000 << (bVar2 & 0x1f);
  }
  return;
}

Assistant:

static INLINE void opj_t1_dec_sigpass_step_raw(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 vsc,
    OPJ_UINT32 ci)
{
    OPJ_UINT32 v;
    opj_mqc_t *mqc = &(t1->mqc);       /* RAW component */

    OPJ_UINT32 const flags = *flagsp;

    if ((flags & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) == 0U &&
            (flags & (T1_SIGMA_NEIGHBOURS << (ci * 3U))) != 0U) {
        if (opj_mqc_raw_decode(mqc)) {
            v = opj_mqc_raw_decode(mqc);
            *datap = v ? -oneplushalf : oneplushalf;
            opj_t1_update_flags(flagsp, ci, v, t1->w + 2, vsc);
        }
        *flagsp |= T1_PI_THIS << (ci * 3U);
    }
}